

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::removeInternalVertex
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint edge)

{
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *this_00;
  AnchorVertex *pAVar1;
  int iVar2;
  long in_FS_OFFSET;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar3;
  char local_70 [24];
  char *local_58;
  undefined1 local_50 [16];
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._12_4_ = 0xaaaaaaaa;
  local_40.second = edge;
  this_00 = &this->m_vertexList;
  local_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40.first = item;
  pVar3 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(this_00,&local_40);
  pAVar1 = pVar3.first;
  local_50._0_8_ = pAVar1;
  if (pAVar1 == (AnchorVertex *)0x0) {
    local_70[0] = '\x02';
    local_70[1] = '\0';
    local_70[2] = '\0';
    local_70[3] = '\0';
    local_70[0x14] = '\0';
    local_70[0x15] = '\0';
    local_70[0x16] = '\0';
    local_70[0x17] = '\0';
    local_70[4] = '\0';
    local_70[5] = '\0';
    local_70[6] = '\0';
    local_70[7] = '\0';
    local_70[8] = '\0';
    local_70[9] = '\0';
    local_70[10] = '\0';
    local_70[0xb] = '\0';
    local_70[0xc] = '\0';
    local_70[0xd] = '\0';
    local_70[0xe] = '\0';
    local_70[0xf] = '\0';
    local_70[0x10] = '\0';
    local_70[0x11] = '\0';
    local_70[0x12] = '\0';
    local_70[0x13] = '\0';
    local_58 = "default";
    QMessageLogger::warning(local_70,"This item with this edge is not in the graph");
  }
  else {
    iVar2 = pVar3.second + -1;
    local_50._8_4_ = iVar2;
    if (iVar2 == 0) {
      QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
      ::removeImpl<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                ((QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
                  *)this_00,&local_40);
      (*pAVar1->_vptr_AnchorVertex[1])(pAVar1);
    }
    else {
      QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
      ::emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>const&>
                ((QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
                  *)this_00,&local_40,(pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> *)local_50)
      ;
      if ((local_50._8_4_ == 2) &&
         ((edge == AnchorVerticalCenter || (edge == AnchorHorizontalCenter)))) {
        removeCenterAnchors(this,item,edge,true);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeInternalVertex(QGraphicsLayoutItem *item,
                                                        Qt::AnchorPoint edge)
{
    std::pair<QGraphicsLayoutItem *, Qt::AnchorPoint> pair(item, edge);
    std::pair<AnchorVertex *, int> v = m_vertexList.value(pair);

    if (!v.first) {
        qWarning("This item with this edge is not in the graph");
        return;
    }

    v.second--;
    if (v.second == 0) {
        // Remove reference and delete vertex
        m_vertexList.remove(pair);
        delete v.first;
    } else {
        // Update reference count
        m_vertexList.insert(pair, v);

        if ((v.second == 2) &&
            ((edge == Qt::AnchorHorizontalCenter) ||
             (edge == Qt::AnchorVerticalCenter))) {
            removeCenterAnchors(item, edge, true);
        }
    }
}